

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

int cornerstone::buffer::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  buffer *this;
  uint uVar1;
  uint uVar2;
  
  uVar1 = *(uint *)src;
  if ((int)uVar1 < 0) {
    uVar2 = uVar1 & 0x7fffffff;
  }
  else {
    uVar2 = (uint)*(ushort *)src;
  }
  if ((int)uVar1 < 0) {
    uVar1 = *(uint *)(src + 4);
  }
  else {
    uVar1 = (uint)*(ushort *)(src + 2);
  }
  alloc((buffer *)dst,(ulong)uVar2 - (ulong)uVar1);
  this = *(buffer **)(dst + 8);
  put(this,(buffer *)src);
  if (*(int *)this < 0) {
    *(undefined4 *)(this + 4) = 0;
  }
  else {
    *(undefined2 *)(this + 2) = 0;
  }
  return (int)dst;
}

Assistant:

bufptr buffer::copy(const buffer& buf)
{
    bufptr other = alloc(buf.size() - buf.pos());
    other->put(buf);
    other->pos(0);
    return other;
}